

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_posix.cpp
# Opt level: O1

void pstore::broker::gc_watch_thread::child_signal(int sig)

{
  int iVar1;
  int *piVar2;
  gc_watch_thread *pgVar3;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  pgVar3 = getgc();
  LOCK();
  (pgVar3->cv_).signal_.super___atomic_base<int>._M_i = sig;
  UNLOCK();
  descriptor_condition_variable::notify_all_no_except(&(pgVar3->cv_).cv_);
  *piVar2 = iVar1;
  return;
}

Assistant:

void gc_watch_thread::child_signal (int const sig) {
            errno_saver const old_errno; //! OCLint(PH - meant to be unused)
            getgc ().cv_.notify_all (sig);
        }